

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableBlockVector.hpp
# Opt level: O0

void __thiscall
gmlc::containers::StableBlockVector<helics::FedInfo,5u,std::allocator<helics::FedInfo>>::
emplace_back<helics::FederateState*>
          (StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_> *this,
          FederateState **args)

{
  long lVar1;
  long lVar2;
  undefined8 *in_RSI;
  long *in_RDI;
  StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_> *unaff_retaddr;
  
  StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::blockCheck
            (unaff_retaddr);
  lVar1 = *(long *)(in_RDI[1] + (long)*(int *)((long)in_RDI + 0x14) * 8);
  lVar2 = in_RDI[3];
  *(int *)(in_RDI + 3) = (int)lVar2 + 1;
  helics::FedInfo::FedInfo((FedInfo *)(lVar1 + (long)(int)lVar2 * 0x10),(FederateState *)*in_RSI);
  *in_RDI = *in_RDI + 1;
  return;
}

Assistant:

void emplace_back(Args&&... args)
        {
            blockCheck();
            new (&(dataptr[dataSlotIndex][bsize++]))
                X(std::forward<Args>(args)...);
            ++csize;
        }